

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alphabet.c
# Opt level: O2

char * get_ptypes(short *S,vrna_md_t *md,uint idx_type)

{
  long lVar1;
  int iVar2;
  char *pcVar3;
  int *__ptr;
  int iVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint length;
  long lVar13;
  long lVar14;
  long lVar15;
  
  if (S == (short *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    length = (uint)*S;
    if (*S < 0) {
      pcVar3 = (char *)0x0;
      vrna_message_warning
                ("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                 (ulong)length);
    }
    else {
      if (idx_type == 0) {
        pcVar3 = vrna_ptypes(S,md);
        return pcVar3;
      }
      pcVar3 = (char *)vrna_alloc(((length + 1) * length >> 1) + 2);
      __ptr = vrna_idx_row_wise(length);
      iVar2 = md->min_loop_size;
      lVar5 = (long)(int)length;
      iVar6 = iVar2 + 2;
      for (uVar9 = 1; (long)uVar9 < (long)(int)(length - iVar2); uVar9 = uVar9 + 1) {
        iVar7 = iVar6;
        for (lVar13 = 1; lVar13 != 3; lVar13 = lVar13 + 1) {
          lVar1 = uVar9 + (long)iVar2 + lVar13;
          if (lVar1 <= lVar5) {
            lVar14 = (long)iVar7;
            lVar15 = (long)pcVar3 - lVar14;
            iVar8 = 0;
            iVar10 = 0;
            uVar12 = uVar9;
            iVar4 = md->pair[S[uVar9]][S[lVar1]];
            for (; (0 < (long)uVar12 && (lVar14 <= lVar5)); lVar14 = lVar14 + 1) {
              if ((1 < uVar12) && (lVar14 < lVar5)) {
                iVar8 = md->pair[S[uVar12 - 1]][S[lVar14 + 1]];
              }
              iVar11 = 0;
              if (iVar10 != 0 || iVar8 != 0) {
                iVar11 = iVar4;
              }
              iVar10 = iVar11;
              if (md->noLP == 0) {
                iVar10 = iVar4;
              }
              *(char *)(lVar15 + __ptr[uVar12]) = (char)iVar10;
              uVar12 = uVar12 - 1;
              lVar15 = lVar15 + -1;
              iVar4 = iVar8;
            }
          }
          iVar7 = iVar7 + 1;
        }
        iVar6 = iVar6 + 1;
      }
      free(__ptr);
    }
  }
  return pcVar3;
}

Assistant:

PUBLIC char *
get_ptypes(const short  *S,
           vrna_md_t    *md,
           unsigned int idx_type)
{
  if (S) {
    if ((unsigned int)S[0] > vrna_sequence_length_max(VRNA_OPTION_DEFAULT)) {
      vrna_message_warning("get_ptypes@alphabet.c: sequence length of %d exceeds addressable range",
                           (int)S[0]);
      return NULL;
    }

    if (idx_type)
      return wrap_get_ptypes(S, md);
    else
      return vrna_ptypes(S, md);
  } else {
    return NULL;
  }
}